

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_ManPrintCollect2_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vNodes)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pObj_00;
  
  iVar1 = Gia_ObjId(p,pObj);
  iVar1 = Vec_IntFind(vNodes,iVar1);
  if (-1 < iVar1) {
    return;
  }
  if ((*(ulong *)pObj & 0x1fffffff) != 0x1fffffff) {
    Gia_ManPrintCollect2_rec(p,pObj + -(*(ulong *)pObj & 0x1fffffff),vNodes);
    uVar2 = (uint)*(undefined8 *)pObj;
    if (-1 < (int)uVar2 && (~uVar2 & 0x1fffffff) != 0) {
      Gia_ManPrintCollect2_rec
                (p,pObj + -(ulong)((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff),vNodes);
    }
  }
  iVar1 = Gia_ObjIsMux(p,pObj);
  if (iVar1 != 0) {
    pObj_00 = Gia_ObjFanin2(p,pObj);
    Gia_ManPrintCollect2_rec(p,pObj_00,vNodes);
  }
  iVar1 = Gia_ObjId(p,pObj);
  Vec_IntPush(vNodes,iVar1);
  return;
}

Assistant:

void Gia_ManPrintCollect2_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vNodes )
{
    if ( Vec_IntFind(vNodes, Gia_ObjId(p, pObj)) >= 0 )
        return;
    if ( Gia_ObjIsCo(pObj) || Gia_ObjIsAnd(pObj) )
        Gia_ManPrintCollect2_rec( p, Gia_ObjFanin0(pObj), vNodes );
    if ( Gia_ObjIsAnd(pObj) )
        Gia_ManPrintCollect2_rec( p, Gia_ObjFanin1(pObj), vNodes );
    if ( Gia_ObjIsMux(p, pObj) )
        Gia_ManPrintCollect2_rec( p, Gia_ObjFanin2(p, pObj), vNodes );
    Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
}